

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::point_m(disp *this,point *p)

{
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  to_string<int>(&local_58,p->x);
  std::operator+(&local_98,"point:",&local_58);
  std::operator+(&local_78,&local_98,"X");
  to_string<int>(&sStack_b8,p->y);
  std::operator+(&local_38,&local_78,&sStack_b8);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void point_m(point const &p) { v_="point:" + to_string(p.x) + "X" + to_string(p.y); }